

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenReader.cpp
# Opt level: O1

int __thiscall ninx::parser::TokenReader::check_limiter(TokenReader *this,char limiter)

{
  pointer puVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  Limiter *this_00;
  _Head_base<0UL,_ninx::lexer::token::Token_*,_false> _Var5;
  
  puVar1 = (this->tokens->
           super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)(long)this->current_token <
      (ulong)((long)(this->tokens->
                    super__Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    _Var5._M_head_impl =
         *(Token **)
          &puVar1[this->current_token]._M_t.
           super___uniq_ptr_impl<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>
    ;
  }
  else {
    _Var5._M_head_impl = (Token *)0x0;
  }
  if ((_Tuple_impl<0UL,_ninx::lexer::token::Token_*,_std::default_delete<ninx::lexer::token::Token>_>
       )_Var5._M_head_impl == (Token *)0x0) {
    uVar4 = 0xffffffff;
  }
  else {
    iVar3 = (**(code **)(*(long *)_Var5._M_head_impl + 0x10))(_Var5._M_head_impl);
    uVar4 = 0;
    if (iVar3 == 1) {
      this_00 = (Limiter *)
                __dynamic_cast(_Var5._M_head_impl,&lexer::token::Token::typeinfo,
                               &lexer::token::Limiter::typeinfo,0);
      cVar2 = lexer::token::Limiter::get_limiter(this_00);
      uVar4 = (uint)(cVar2 == limiter);
    }
  }
  return uVar4;
}

Assistant:

int ninx::parser::TokenReader::check_limiter(char limiter) {
    auto token = peek_token();
    if (!token) {
        return -1;
    }

    if (token->get_type() != Type::LIMITER) {
        return 0;
    }

    if (dynamic_cast<ninx::lexer::token::Limiter*>(token)->get_limiter() == limiter) {
        return 1;
    }

    return 0;
}